

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_write::BinBinaryWriter::write_value_visit
          (BinBinaryWriter *this,Embed *value)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  pointer pFVar2;
  pointer pcVar3;
  bool bVar4;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_moonshadow565[P]ritobin_ritobin_lib_src_ritobin_bin_types_helper_hpp:14:31),_const_std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_&>
  _Var5;
  bool bVar6;
  ssize_t sVar7;
  size_t __n;
  void *__buf;
  byte unaff_BPL;
  char *msg;
  pointer pFVar8;
  anon_class_1_0_00000001 local_39;
  size_t local_38;
  
  BinaryWriter::write<unsigned_int>(&this->writer,(value->name).hash_);
  pvVar1 = (this->writer).buffer_;
  __n = (long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_38 = __n;
  BinaryWriter::write<unsigned_int>(&this->writer,0);
  BinaryWriter::write<unsigned_short>
            (&this->writer,
             (short)((uint)(*(int *)&(value->items).
                                     super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(value->items).
                                    super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) * 0x6db7);
  pFVar2 = (value->items).super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pFVar8 = (value->items).super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
                _M_impl.super__Vector_impl_data._M_start; bVar4 = pFVar8 == pFVar2, !bVar4;
      pFVar8 = pFVar8 + 1) {
    BinaryWriter::write<unsigned_int>(&this->writer,(pFVar8->key).hash_);
    _Var5 = std::
            visit<ritobin::ValueHelperImpl<std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>::value_to_type(std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>const&)::_lambda(auto:1&&)_1_,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>const&>
                      (&local_39,&pFVar8->value);
    sVar7 = BinaryWriter::write(&this->writer,(uint)_Var5,__buf,__n);
    msg = "writer.write(ValueHelper::value_to_type(item))\n";
    if ((char)sVar7 == '\0') {
LAB_001165ab:
      unaff_BPL = fail_msg(this,msg);
      __n = 0;
    }
    else {
      bVar6 = write_value(this,&pFVar8->value);
      __n = CONCAT71((int7)(__n >> 8),1);
      msg = "write_value(item)\n";
      if (!bVar6) goto LAB_001165ab;
    }
    if ((char)__n == '\0') break;
  }
  if (bVar4) {
    pvVar1 = (this->writer).buffer_;
    pcVar3 = (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(int *)(pcVar3 + local_38) =
         (*(int *)&(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - ((int)local_38 + (int)pcVar3)) + -4;
    unaff_BPL = 1;
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool write_value_visit(Embed const& value) noexcept {
            writer.write(value.name);
            size_t position = writer.position();
            writer.write(uint32_t{ 0 });
            writer.write(static_cast<uint16_t>(value.items.size()));
            for (auto const& [name, item] : value.items) {
                writer.write(name.hash());
                bin_assert(writer.write(ValueHelper::value_to_type(item)));
                bin_assert(write_value(item));
            }
            writer.write_at(position, writer.position() - position - 4);
            return true;
        }